

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::FunctionSerializer::FunctionDeserialize<duckdb::AggregateFunction>
          (FunctionSerializer *this,Deserializer *deserializer,AggregateFunction *function)

{
  SerializationException *this_00;
  anon_class_16_2_a14c9434 func;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (function->deserialize != (aggregate_deserialize_t)0x0) {
    *(undefined8 *)this = 0;
    func.function = function;
    func.result = (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                   *)this;
    Deserializer::
    ReadObject<duckdb::FunctionSerializer::FunctionDeserialize<duckdb::AggregateFunction>(duckdb::Deserializer&,duckdb::AggregateFunction&)::_lambda(duckdb::Deserializer&)_1_>
              (deserializer,0x1f8,"function_data",func);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Function requires deserialization but no deserialization function for %s",&local_59);
  ::std::__cxx11::string::string
            ((string *)&local_58,
             (string *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
  SerializationException::SerializationException<std::__cxx11::string>(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> FunctionDeserialize(Deserializer &deserializer, FUNC &function) {
		if (!function.deserialize) {
			throw SerializationException("Function requires deserialization but no deserialization function for %s",
			                             function.name);
		}
		unique_ptr<FunctionData> result;
		deserializer.ReadObject(504, "function_data",
		                        [&](Deserializer &obj) { result = function.deserialize(obj, function); });
		return result;
	}